

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<datarate_test::(anonymous_namespace)::DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test>
::CreateTest(ParameterizedTestFactory<datarate_test::(anonymous_namespace)::DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test>
             *this)

{
  DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test *this_00;
  long in_RDI;
  Test *local_28;
  
  WithParamInterface<const_libaom_test::AV1CodecFactory_*>::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test *)operator_new(0x4e0);
  datarate_test::anon_unknown_0::DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test::
  DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test(this_00);
  local_28 = (Test *)0x0;
  if (this_00 != (DatarateTestSetFrameQpRealtime_SetFrameQpOnePass_Test *)0x0) {
    local_28 = &(this_00->super_DatarateTestSetFrameQpRealtime).
                super_TestWithParam<const_libaom_test::AV1CodecFactory_*>.super_Test;
  }
  return local_28;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }